

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderDirectiveTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::executeAccessingBoundingBoxType
               (NegativeTestContext *ctx,string *builtInTypeName,GLSLVersion glslVersion)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long *plVar3;
  ostream *poVar4;
  size_type *psVar5;
  ulong *puVar6;
  long *plVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  char *pcVar9;
  string extensionPrim;
  string version;
  string extensionTess;
  ostringstream sourceStream;
  string local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  char *local_308;
  char *local_300;
  char local_2f8;
  undefined7 uStack_2f7;
  char *local_2e8;
  long local_2e0;
  char local_2d8;
  undefined7 uStack_2d7;
  long *local_2c8;
  long local_2c0;
  long local_2b8;
  long lStack_2b0;
  long *local_2a8;
  long local_2a0;
  long local_298;
  long lStack_290;
  char *local_288;
  char *local_280;
  char local_278;
  undefined7 uStack_277;
  string local_268;
  string local_248;
  string local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_2e8 = &local_2d8;
  local_2e0 = 0;
  local_2d8 = '\0';
  local_308 = &local_2f8;
  local_300 = (char *)0x0;
  local_2f8 = '\0';
  local_288 = &local_278;
  local_280 = (char *)0x0;
  local_278 = '\0';
  if (glslVersion == GLSL_VERSION_310_ES) {
    std::__cxx11::string::_M_replace((ulong)&local_2e8,0,(char *)0x0,0x1b35acb);
    std::__cxx11::string::_M_replace((ulong)&local_308,0,local_300,0x1cc01c2);
    pcVar9 = "#extension GL_EXT_tessellation_shader : require\n";
  }
  else {
    std::__cxx11::string::_M_replace((ulong)&local_2e8,0,(char *)0x0,0x1c9b29c);
    pcVar9 = "";
    std::__cxx11::string::_M_replace((ulong)&local_308,0,local_300,0x1b32ab9);
  }
  std::__cxx11::string::_M_replace((ulong)&local_288,0,local_280,(ulong)pcVar9);
  std::operator+(&local_368,"cannot access built-in type ",builtInTypeName);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_368);
  paVar8 = &local_348.field_2;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_348.field_2._M_allocated_capacity = *psVar5;
    local_348.field_2._8_8_ = plVar3[3];
    local_348._M_dataplus._M_p = (pointer)paVar8;
  }
  else {
    local_348.field_2._M_allocated_capacity = *psVar5;
    local_348._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_348._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_348);
  paVar1 = &local_388.field_2;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_388.field_2._M_allocated_capacity = *psVar5;
    local_388.field_2._8_8_ = plVar3[3];
    local_388._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_388.field_2._M_allocated_capacity = *psVar5;
    local_388._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_388._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  NegativeTestContext::beginSection(ctx,&local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != paVar1) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != paVar8) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_2e8,local_2e0);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_308,(long)local_300);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"void main()\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{\n",2);
  std::operator+(&local_348,"\t",builtInTypeName);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_348);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar6) {
    local_388.field_2._M_allocated_capacity = *puVar6;
    local_388.field_2._8_8_ = plVar3[3];
    local_388._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_388.field_2._M_allocated_capacity = *puVar6;
    local_388._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_388._M_string_length = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_388._M_dataplus._M_p,local_388._M_string_length);
  std::operator+(&local_328,"\tgl_Position = ",builtInTypeName);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_328);
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_368.field_2._M_allocated_capacity = *psVar5;
    local_368.field_2._8_8_ = plVar3[3];
  }
  else {
    local_368.field_2._M_allocated_capacity = *psVar5;
    local_368._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_368._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_368._M_dataplus._M_p,local_368._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != paVar1) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != paVar8) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  verifyShader(ctx,SHADERTYPE_VERTEX,&local_1c8,EXPECT_RESULT_FAIL);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  NegativeTestContext::endSection(ctx);
  local_388._M_string_length = 0;
  local_388.field_2._M_allocated_capacity =
       local_388.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_388._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != paVar1) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  bVar2 = NegativeTestContext::isShaderSupported(ctx,SHADERTYPE_TESSELLATION_EVALUATION);
  if (bVar2) {
    std::operator+(&local_368,"cannot access built-in type ",builtInTypeName);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_368);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_348.field_2._M_allocated_capacity = *psVar5;
      local_348.field_2._8_8_ = plVar3[3];
      local_348._M_dataplus._M_p = (pointer)paVar8;
    }
    else {
      local_348.field_2._M_allocated_capacity = *psVar5;
      local_348._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_348._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_348);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_388.field_2._M_allocated_capacity = *psVar5;
      local_388.field_2._8_8_ = plVar3[3];
      local_388._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_388.field_2._M_allocated_capacity = *psVar5;
      local_388._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_388._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    NegativeTestContext::beginSection(ctx,&local_388);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != paVar1) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != paVar8) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_2e8,local_2e0);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_308,(long)local_300);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_288,(long)local_280);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"layout (triangles, equal_spacing, ccw) in;\n",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"void main()\n",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{\n",2);
    std::operator+(&local_348,"\t",builtInTypeName);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_348);
    puVar6 = (ulong *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_388.field_2._M_allocated_capacity = *puVar6;
      local_388.field_2._8_8_ = plVar3[3];
      local_388._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_388.field_2._M_allocated_capacity = *puVar6;
      local_388._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_388._M_string_length = plVar3[1];
    *plVar3 = (long)puVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_388._M_dataplus._M_p,local_388._M_string_length);
    std::operator+(&local_328,"\tgl_Position = (\tgl_TessCoord.x * ",builtInTypeName);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_328);
    local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_368.field_2._M_allocated_capacity = *psVar5;
      local_368.field_2._8_8_ = plVar3[3];
    }
    else {
      local_368.field_2._M_allocated_capacity = *psVar5;
      local_368._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_368._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_368._M_dataplus._M_p,local_368._M_string_length);
    std::operator+(&local_1e8,"\t\t\t\t\tgl_TessCoord.y * ",builtInTypeName);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_1e8);
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_298 = *plVar7;
      lStack_290 = plVar3[3];
      local_2a8 = &local_298;
    }
    else {
      local_298 = *plVar7;
      local_2a8 = (long *)*plVar3;
    }
    local_2a0 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_2a8,local_2a0);
    std::operator+(&local_208,"\t\t\t\t\tgl_TessCoord.z * ",builtInTypeName);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_208);
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_2b8 = *plVar7;
      lStack_2b0 = plVar3[3];
      local_2c8 = &local_2b8;
    }
    else {
      local_2b8 = *plVar7;
      local_2c8 = (long *)*plVar3;
    }
    local_2c0 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_2c8,local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}\n",2);
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != paVar1) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    verifyShader(ctx,SHADERTYPE_TESSELLATION_EVALUATION,&local_228,EXPECT_RESULT_FAIL);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    NegativeTestContext::endSection(ctx);
    local_388._M_string_length = 0;
    local_388.field_2._M_allocated_capacity =
         local_388.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_388._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != paVar1) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
  }
  paVar8 = &local_348.field_2;
  bVar2 = NegativeTestContext::isShaderSupported(ctx,SHADERTYPE_GEOMETRY);
  if (bVar2) {
    std::operator+(&local_368,"cannot access built-in type ",builtInTypeName);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_368);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_348.field_2._M_allocated_capacity = *psVar5;
      local_348.field_2._8_8_ = plVar3[3];
      local_348._M_dataplus._M_p = (pointer)paVar8;
    }
    else {
      local_348.field_2._M_allocated_capacity = *psVar5;
      local_348._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_348._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_348);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_388.field_2._M_allocated_capacity = *psVar5;
      local_388.field_2._8_8_ = plVar3[3];
      local_388._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_388.field_2._M_allocated_capacity = *psVar5;
      local_388._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_388._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    NegativeTestContext::beginSection(ctx,&local_388);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != paVar1) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != paVar8) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_2e8,local_2e0);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_308,(long)local_300);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"layout (triangles) in;\n",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"layout (triangle_strip, max_vertices = 3) out;\n",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"void main()\n",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{\n",2);
    std::operator+(&local_348,"\t",builtInTypeName);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_348);
    puVar6 = (ulong *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_388.field_2._M_allocated_capacity = *puVar6;
      local_388.field_2._8_8_ = plVar3[3];
      local_388._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_388.field_2._M_allocated_capacity = *puVar6;
      local_388._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_388._M_string_length = plVar3[1];
    *plVar3 = (long)puVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_388._M_dataplus._M_p,local_388._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"\tfor (int idx = 0; idx < 3; idx++)\n",0x23);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t{\n",3);
    std::operator+(&local_328,"\t\tgl_Position = gl_in[idx].gl_Position * ",builtInTypeName);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_328);
    local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_368.field_2._M_allocated_capacity = *psVar5;
      local_368.field_2._8_8_ = plVar3[3];
    }
    else {
      local_368.field_2._M_allocated_capacity = *psVar5;
      local_368._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_368._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_368._M_dataplus._M_p,local_368._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\tEmitVertex();\n",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t}\n",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tEndPrimitive();\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != paVar1) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != paVar8) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    verifyShader(ctx,SHADERTYPE_GEOMETRY,&local_248,EXPECT_RESULT_FAIL);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    NegativeTestContext::endSection(ctx);
    local_388._M_string_length = 0;
    local_388.field_2._M_allocated_capacity =
         local_388.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_388._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != paVar1) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
  }
  std::operator+(&local_368,"cannot access built-in type ",builtInTypeName);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_368);
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_348.field_2._M_allocated_capacity = *psVar5;
    local_348.field_2._8_8_ = plVar3[3];
    local_348._M_dataplus._M_p = (pointer)paVar8;
  }
  else {
    local_348.field_2._M_allocated_capacity = *psVar5;
    local_348._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_348._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_348);
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_388.field_2._M_allocated_capacity = *psVar5;
    local_388.field_2._8_8_ = plVar3[3];
    local_388._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_388.field_2._M_allocated_capacity = *psVar5;
    local_388._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_388._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  NegativeTestContext::beginSection(ctx,&local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != paVar1) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != paVar8) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_2e8,local_2e0);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_308,(long)local_300);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"layout (location = 0) out mediump vec4 fs_colour;\n",0x32);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"void main()\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{\n",2);
  std::operator+(&local_348,"\t",builtInTypeName);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_348);
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_388.field_2._M_allocated_capacity = *psVar5;
    local_388.field_2._8_8_ = plVar3[3];
    local_388._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_388.field_2._M_allocated_capacity = *psVar5;
    local_388._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_388._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_388._M_dataplus._M_p,local_388._M_string_length);
  std::operator+(&local_328,"\tfs_colour = ",builtInTypeName);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_328);
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_368.field_2._M_allocated_capacity = *psVar5;
    local_368.field_2._8_8_ = plVar3[3];
  }
  else {
    local_368.field_2._M_allocated_capacity = *psVar5;
    local_368._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_368._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_368._M_dataplus._M_p,local_368._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != paVar1) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != paVar8) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  verifyShader(ctx,SHADERTYPE_FRAGMENT,&local_268,EXPECT_RESULT_FAIL);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  NegativeTestContext::endSection(ctx);
  if (local_288 != &local_278) {
    operator_delete(local_288,CONCAT71(uStack_277,local_278) + 1);
  }
  if (local_308 != &local_2f8) {
    operator_delete(local_308,CONCAT71(uStack_2f7,local_2f8) + 1);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8,CONCAT71(uStack_2d7,local_2d8) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void executeAccessingBoundingBoxType (NegativeTestContext& ctx, const std::string builtInTypeName, glu::GLSLVersion glslVersion)
{
	std::ostringstream	sourceStream;
	std::string			version;
	std::string			extensionPrim;
	std::string			extensionTess;

	if (glslVersion == glu::GLSL_VERSION_310_ES)
	{
		version = "#version 310 es\n";
		extensionPrim = "#extension GL_EXT_primitive_bounding_box : require\n";
		extensionTess = "#extension GL_EXT_tessellation_shader : require\n";
	}
	else if (glslVersion >= glu::GLSL_VERSION_320_ES)
	{
		version = "#version 320 es\n";
		extensionPrim = "";
		extensionTess = "";
	}
	else
	{
		DE_FATAL("error: context below 3.1 and not supported");
	}

	ctx.beginSection("cannot access built-in type " + builtInTypeName + "[]" + " in vertex shader");
	sourceStream	<< version
					<< extensionPrim
					<< "void main()\n"
					<< "{\n"
					<< "	" + builtInTypeName + "[0] = vec4(1.0, 1.0, 1.0, 1.0);\n"
					<< "	gl_Position = " + builtInTypeName + "[0];\n"
					<< "}\n";
	verifyShader(ctx, glu::SHADERTYPE_VERTEX, sourceStream.str(), EXPECT_RESULT_FAIL);
	ctx.endSection();

	sourceStream.str(std::string());

	if (ctx.isShaderSupported(glu::SHADERTYPE_TESSELLATION_EVALUATION))
	{
		ctx.beginSection("cannot access built-in type " + builtInTypeName + "[]" + " in tessellation evaluation shader");
		sourceStream	<< version
						<< extensionPrim
						<< extensionTess
						<< "layout (triangles, equal_spacing, ccw) in;\n"
						<< "void main()\n"
						<< "{\n"
						<< "	" + builtInTypeName + "[0] = vec4(1.0, 1.0, 1.0, 1.0);\n"
						<< "	gl_Position = (	gl_TessCoord.x * " +  builtInTypeName + "[0] +\n"
						<< "					gl_TessCoord.y * " +  builtInTypeName + "[0] +\n"
						<< "					gl_TessCoord.z * " +  builtInTypeName + "[0]);\n"
						<< "}\n";
		verifyShader(ctx, glu::SHADERTYPE_TESSELLATION_EVALUATION, sourceStream.str(), EXPECT_RESULT_FAIL);
		ctx.endSection();

		sourceStream.str(std::string());
	}

	if (ctx.isShaderSupported(glu::SHADERTYPE_GEOMETRY))
	{
		ctx.beginSection("cannot access built-in type " + builtInTypeName + "[]" + " in geometry shader");
		sourceStream	<< version
						<< extensionPrim
						<< "layout (triangles) in;\n"
						<< "layout (triangle_strip, max_vertices = 3) out;\n"
						<< "void main()\n"
						<< "{\n"
						<< "	" + builtInTypeName + "[0] = vec4(1.0, 1.0, 1.0, 1.0);\n"
						<< "	for (int idx = 0; idx < 3; idx++)\n"
						<< "	{\n"
						<< "		gl_Position = gl_in[idx].gl_Position * " + builtInTypeName + "[0];\n"
						<< "		EmitVertex();\n"
						<< "	}\n"
						<< "	EndPrimitive();\n"
						<< "}\n";
		verifyShader(ctx, glu::SHADERTYPE_GEOMETRY, sourceStream.str(), EXPECT_RESULT_FAIL);
		ctx.endSection();

		sourceStream.str(std::string());
	}

	ctx.beginSection("cannot access built-in type " + builtInTypeName + "[]" + " in fragment shader");
	sourceStream	<< version
					<< extensionPrim
					<< "layout (location = 0) out mediump vec4 fs_colour;\n"
					<< "void main()\n"
					<< "{\n"
					<< "	" + builtInTypeName + "[0] = vec4(1.0, 1.0, 1.0, 1.0);\n"
					<< "	fs_colour = " + builtInTypeName + "[0];\n"
					<< "}\n";
	verifyShader(ctx, glu::SHADERTYPE_FRAGMENT, sourceStream.str(), EXPECT_RESULT_FAIL);
	ctx.endSection();
}